

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O2

void LoadBytes(AES_state *s,uchar *data16)

{
  long lVar1;
  long lVar2;
  int c;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (c = 0; c != 4; c = c + 1) {
    for (lVar2 = 0; (int)lVar2 != 4; lVar2 = lVar2 + 1) {
      LoadByte(s,data16[lVar2],(int)lVar2,c);
    }
    data16 = data16 + lVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void LoadBytes(AES_state *s, const unsigned char* data16) {
    int c;
    for (c = 0; c < 4; c++) {
        int r;
        for (r = 0; r < 4; r++) {
            LoadByte(s, *(data16++), r, c);
        }
    }
}